

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_IF_Spline.H
# Opt level: O0

Real __thiscall amrex::EB2::SplineIF::operator()(SplineIF *this,RealArray *p)

{
  Real i;
  Real j;
  distFcnElement2d *pdVar1;
  bool bVar2;
  const_reference pvVar3;
  reference ppdVar4;
  literals *this_00;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  Real side;
  Real d;
  distFcnElement2d *geom;
  const_iterator __end2;
  const_iterator __begin2;
  Vector<amrex::distFcnElement2d_*,_std::allocator<amrex::distFcnElement2d_*>_> *__range2;
  RealVect x;
  Real dist;
  distFcnElement2d *closesetGeomElement;
  RealVect cp;
  vector<amrex::distFcnElement2d_*,_std::allocator<amrex::distFcnElement2d_*>_> *this_01;
  undefined2 in_stack_ffffffffffffff20;
  undefined2 uVar5;
  undefined6 in_stack_ffffffffffffff22;
  __normal_iterator<amrex::distFcnElement2d_*const_*,_std::vector<amrex::distFcnElement2d_*,_std::allocator<amrex::distFcnElement2d_*>_>_>
  local_60 [2];
  RealVect local_50;
  Real local_38;
  distFcnElement2d *local_30;
  literals local_28 [40];
  
  this_00 = local_28;
  RealVect::RealVect((RealVect *)CONCAT62(in_stack_ffffffffffffff22,in_stack_ffffffffffffff20));
  this_01 = SUB108(_DAT_019557a0,0);
  uVar5 = (undefined2)((unkuint10)_DAT_019557a0 >> 0x40);
  local_38 = literals::operator____rt(this_00,_DAT_019557a0);
  pvVar3 = std::array<double,_3UL>::operator[]
                     ((array<double,_3UL> *)CONCAT62(in_stack_ffffffffffffff22,uVar5),
                      (size_type)this_01);
  i = *pvVar3;
  pvVar3 = std::array<double,_3UL>::operator[]
                     ((array<double,_3UL> *)CONCAT62(in_stack_ffffffffffffff22,uVar5),
                      (size_type)this_01);
  j = *pvVar3;
  pvVar3 = std::array<double,_3UL>::operator[]
                     ((array<double,_3UL> *)CONCAT62(in_stack_ffffffffffffff22,uVar5),
                      (size_type)this_01);
  RealVect::RealVect(&local_50,i,j,*pvVar3);
  local_60[0]._M_current =
       (distFcnElement2d **)
       std::vector<amrex::distFcnElement2d_*,_std::allocator<amrex::distFcnElement2d_*>_>::begin
                 (this_01);
  std::vector<amrex::distFcnElement2d_*,_std::allocator<amrex::distFcnElement2d_*>_>::end(this_01);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<amrex::distFcnElement2d_*const_*,_std::vector<amrex::distFcnElement2d_*,_std::allocator<amrex::distFcnElement2d_*>_>_>
                        *)CONCAT62(in_stack_ffffffffffffff22,uVar5),
                       (__normal_iterator<amrex::distFcnElement2d_*const_*,_std::vector<amrex::distFcnElement2d_*,_std::allocator<amrex::distFcnElement2d_*>_>_>
                        *)this_01);
    if (!bVar2) break;
    ppdVar4 = __gnu_cxx::
              __normal_iterator<amrex::distFcnElement2d_*const_*,_std::vector<amrex::distFcnElement2d_*,_std::allocator<amrex::distFcnElement2d_*>_>_>
              ::operator*(local_60);
    pdVar1 = *ppdVar4;
    uVar5 = SUB82(local_50.vect[1],0);
    in_stack_ffffffffffffff22 = (undefined6)((ulong)local_50.vect[1] >> 0x10);
    this_01 = (vector<amrex::distFcnElement2d_*,_std::allocator<amrex::distFcnElement2d_*>_> *)
              local_50.vect[0];
    (*pdVar1->_vptr_distFcnElement2d[1])(pdVar1,local_28);
    if (extraout_XMM0_Qa < local_38) {
      local_38 = extraout_XMM0_Qa;
      local_30 = pdVar1;
    }
    __gnu_cxx::
    __normal_iterator<amrex::distFcnElement2d_*const_*,_std::vector<amrex::distFcnElement2d_*,_std::allocator<amrex::distFcnElement2d_*>_>_>
    ::operator++(local_60);
  }
  (*local_30->_vptr_distFcnElement2d[2])(local_30,local_28);
  return local_38 * extraout_XMM0_Qa_00;
}

Assistant:

amrex::Real operator() (const amrex::RealArray& p) const {
    amrex::RealVect cp;
    distFcnElement2d * closesetGeomElement;
    amrex::Real dist;
    dist = 1.0e29_rt;
    amrex::RealVect x(AMREX_D_DECL(p[0], p[1], p[2]));
    for (auto * geom : geomElements ) {
      amrex::Real d = geom->cpdist(x, cp);
      if (d < dist) {
        dist = d;
        closesetGeomElement = geom;
      }
    }
    amrex::Real side = closesetGeomElement->cpside(x,cp);
    return dist*side;
  }